

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

void Potassco::fail(int ec,char *file,uint line,char *exp,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  logic_error *plVar2;
  length_error *this;
  undefined8 uVar3;
  invalid_argument *this_00;
  domain_error *this_01;
  out_of_range *this_02;
  overflow_error *this_03;
  runtime_error *prVar4;
  long in_RCX;
  uint in_EDX;
  char *pcVar5;
  long in_RSI;
  int in_EDI;
  char *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t sz;
  char *pos;
  va_list args;
  StringBuilder str;
  char msg [1024];
  Mode in_stack_fffffffffffffa2c;
  bad_alloc *in_stack_fffffffffffffa30;
  char *in_stack_fffffffffffffa38;
  StringBuilder *in_stack_fffffffffffffa40;
  undefined1 local_558 [40];
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_518;
  undefined8 local_508;
  undefined8 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  size_t local_4a8;
  char *local_4a0;
  undefined4 local_498;
  undefined4 local_494;
  undefined1 *local_490;
  undefined1 *local_488;
  char local_428 [1016];
  
  if (in_AL != '\0') {
    local_528 = in_XMM0_Qa;
    local_518 = in_XMM1_Qa;
    local_508 = in_XMM2_Qa;
    local_4f8 = in_XMM3_Qa;
    local_4e8 = in_XMM4_Qa;
    local_4d8 = in_XMM5_Qa;
    local_4c8 = in_XMM6_Qa;
    local_4b8 = in_XMM7_Qa;
  }
  local_530 = in_R9;
  if (in_EDI == 0) {
    fail(0x16,
         "void Potassco::fail(int, const char *, unsigned int, const char *, const char *, ...)",
         0x1c4,"ec != 0","error code must not be 0",0);
  }
  StringBuilder::StringBuilder
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,(size_t)in_stack_fffffffffffffa30,
             in_stack_fffffffffffffa2c);
  if ((in_EDI < 1) && (in_EDI != -1)) {
    if (in_R8 == (char *)0x0) {
      pcVar5 = "runtime";
      if (in_EDI == -2) {
        pcVar5 = "logic";
      }
      StringBuilder::appendFormat((StringBuilder *)&stack0xfffffffffffffb98,"%s error: ",pcVar5);
    }
  }
  else {
    if ((in_RSI != 0) && (in_EDX != 0)) {
      StringBuilder::appendFormat
                ((StringBuilder *)&stack0xfffffffffffffb98,"%s@%u: ",in_RSI,(ulong)in_EDX);
    }
    if (0 < in_EDI) {
      strerror(in_EDI);
    }
    StringBuilder::append(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    StringBuilder::append(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  }
  if (in_R8 == (char *)0x0) {
    if (in_RCX != 0) {
      StringBuilder::appendFormat
                ((StringBuilder *)&stack0xfffffffffffffb98,"check(\'%s\') failed",in_RCX);
    }
  }
  else {
    local_488 = local_558;
    local_490 = &stack0x00000008;
    local_494 = 0x30;
    local_498 = 0x28;
    sVar1 = StringBuilder::size(in_stack_fffffffffffffa40);
    local_4a0 = local_428 + sVar1;
    sVar1 = StringBuilder::size(in_stack_fffffffffffffa40);
    local_4a8 = 0x400 - sVar1;
    vsnprintf(local_4a0,local_4a8,in_R8,&local_498);
  }
  switch(in_EDI) {
  default:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,local_428);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 7:
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this,local_428);
    __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
  case 0xc:
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_fffffffffffffa30);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  case 0x16:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,local_428);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 0x21:
    this_01 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this_01,local_428);
    __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  case 0x22:
    this_02 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_02,local_428);
    __cxa_throw(this_02,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  case 0x4b:
    this_03 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_03,local_428);
    __cxa_throw(this_03,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  case -3:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,local_428);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case -2:
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,local_428);
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case -1:
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,local_428);
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

void fail(int ec, const char* file, unsigned line, const char* exp, const char* fmt, ...) {
	POTASSCO_CHECK(ec != 0, EINVAL, "error code must not be 0");
	char msg[1024];
	StringBuilder str(msg, sizeof(msg));
	if (ec > 0 || ec == error_assert) {
		if (file && line) { str.appendFormat("%s@%u: ", file, line); }
		str.append(ec > 0 ? strerror(ec) : "assertion failure");
		str.append(": ");
	}
	else if (!fmt) {
		str.appendFormat("%s error: ", ec == error_logic ? "logic" : "runtime");
	}
	if (fmt) {
		va_list args;
		va_start(args, fmt);
		char* pos = msg + str.size();
		size_t sz = sizeof(msg) - str.size();
		vsnprintf(pos, sz, fmt, args);
		va_end(args);
	}
	else if (exp) {
		str.appendFormat("check('%s') failed", exp);
	}
	switch (ec) {
		case error_logic  : throw std::logic_error(msg);
		case error_assert : throw std::logic_error(msg);
		case error_runtime: throw std::runtime_error(msg);
		case E2BIG        : throw std::length_error(msg);
		case ENOMEM       : throw std::bad_alloc();
		case EINVAL       : throw std::invalid_argument(msg);
		case EDOM         : throw std::domain_error(msg);
		case ERANGE       : throw std::out_of_range(msg);
#if defined(EOVERFLOW)
		case EOVERFLOW    : throw std::overflow_error(msg);
#endif
		default           : throw std::runtime_error(msg);
	}
}